

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::FieldDescriptorProto::_InternalSerialize
          (FieldDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  FieldOptions *value;
  uint8_t *puVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  char *in_R9;
  undefined8 *puVar7;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  
  uVar2 = *(uint *)&this->field_0;
  if ((uVar2 & 1) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.FieldDescriptorProto.name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x29,field_name);
    s._M_str = (char *)*puVar7;
    s._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if ((uVar2 & 2) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.FieldDescriptorProto.extendee";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x2d,field_name_00);
    s_00._M_str = (char *)*puVar7;
    s_00._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s_00,target);
  }
  if ((uVar2 & 0x40) != 0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.number_,target);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.label_;
    pbVar4 = target + 1;
    *target = 0x20;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.type_;
    pbVar4 = target + 1;
    *target = 0x28;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  if ((uVar2 & 4) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"google.protobuf.FieldDescriptorProto.type_name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x2e,field_name_01);
    s_01._M_str = (char *)*puVar7;
    s_01._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,6,s_01,target);
  }
  if ((uVar2 & 8) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.default_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_02._M_str = in_R9;
    field_name_02._M_len = (size_t)"google.protobuf.FieldDescriptorProto.default_value";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x32,field_name_02);
    s_02._M_str = (char *)*puVar7;
    s_02._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,7,s_02,target);
  }
  if ((uVar2 & 0x20) != 0) {
    value = (this->field_0)._impl_.options_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (8,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if ((char)uVar2 < '\0') {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<9>
                       (stream,(this->field_0)._impl_.oneof_index_,target);
  }
  if ((uVar2 & 0x10) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_03._M_str = in_R9;
    field_name_03._M_len = (size_t)"google.protobuf.FieldDescriptorProto.json_name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x2e,field_name_03);
    s_03._M_str = (char *)*puVar7;
    s_03._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,10,s_03,target);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.proto3_optional_;
    target[0] = 0x88;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string extendee = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_extendee();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.extendee");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 number = 3;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_type(), target);
  }

  // optional string type_name = 6;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_type_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.type_name");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // optional string default_value = 7;
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_default_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.default_value");
    target = stream->WriteStringMaybeAliased(7, _s, target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        8, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // optional int32 oneof_index = 9;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<9>(
            stream, this_._internal_oneof_index(), target);
  }

  // optional string json_name = 10;
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_json_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.json_name");
    target = stream->WriteStringMaybeAliased(10, _s, target);
  }

  // optional bool proto3_optional = 17;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        17, this_._internal_proto3_optional(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}